

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
::doApply(IRet *__return_storage_ptr__,
         GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool *pbVar1;
  long lVar2;
  undefined8 local_68;
  double dStack_60;
  undefined8 local_58;
  bool *local_50;
  bool *local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x50);
  lVar2 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar2 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x50);
  lVar2 = 0;
  do {
    local_50 = &iargs->a->m_data[0].m_hasNaN + lVar2;
    local_48 = &iargs->b->m_data[0].m_hasNaN + lVar2;
    local_40 = *(undefined4 *)&iargs->c;
    uStack_3c = *(undefined4 *)((long)&iargs->c + 4);
    uStack_38 = *(undefined4 *)&iargs->d;
    uStack_34 = *(undefined4 *)((long)&iargs->d + 4);
    (*(this->m_func->super_FuncBase)._vptr_FuncBase[8])(&local_68,this->m_func,ctx,&local_50);
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar2) = local_58;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar2;
    *(undefined8 *)pbVar1 = local_68;
    *(double *)(pbVar1 + 8) = dStack_60;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply					(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet ret;

		for (int ndx = 0; ndx < Size; ++ndx)
		{
			ret[ndx] =
				m_func.apply(ctx, iargs.a[ndx], iargs.b[ndx], iargs.c[ndx], iargs.d[ndx]);
		}

		return ret;
	}